

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

size_t __thiscall edition_unittest::TestDeprecatedFields::ByteSizeLong(TestDeprecatedFields *this)

{
  int iVar1;
  long lVar2;
  anon_union_64_1_493b367e_for_TestDeprecatedFields_3 aVar3;
  uint uVar4;
  uint uVar5;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar6;
  size_t sVar7;
  ulong uVar8;
  uint index;
  int n;
  ulong total_size;
  
  uVar5 = *(uint *)((long)&this->field_0 + 0x10);
  total_size = (ulong)uVar5;
  if (0 < (int)uVar5) {
    index = 0;
    do {
      pVVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.deprecated_repeated_string_.
                           super_RepeatedPtrFieldBase,index);
      uVar4 = (uint)pVVar6->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      total_size = total_size + pVVar6->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar5 != index);
  }
  aVar3 = this->field_0;
  if (((undefined1  [64])aVar3 & (undefined1  [64])0x7) != (undefined1  [64])0x0) {
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x1) != (undefined1  [64])0x0) {
      sVar7 = TestAllTypes_NestedMessage::ByteSizeLong((this->field_0)._impl_.deprecated_message_);
      uVar5 = (uint)sVar7 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      total_size = total_size + sVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
      sVar7 = ByteSizeLong((this->field_0)._impl_.nested_);
      uVar5 = (uint)sVar7 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      total_size = total_size + sVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x4) != (undefined1  [64])0x0) {
      uVar8 = (long)(this->field_0)._impl_.deprecated_int32_ | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      total_size = total_size + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  if ((this->field_0)._impl_._oneof_case_[0] == 2) {
    uVar8 = (long)(this->field_0)._impl_.oneof_fields_.deprecated_int32_in_oneof_ | 1;
    lVar2 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    total_size = total_size + ((int)lVar2 * 9 + 0x89U >> 6);
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,total_size,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t TestDeprecatedFields::ByteSizeLong() const {
  const TestDeprecatedFields& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestDeprecatedFields)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string deprecated_repeated_string = 4 [deprecated = true];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_deprecated_repeated_string().size());
      for (int i = 0, n = this_._internal_deprecated_repeated_string().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_deprecated_repeated_string().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // .edition_unittest.TestAllTypes.NestedMessage deprecated_message = 3 [deprecated = true];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.deprecated_message_);
    }
    // .edition_unittest.TestDeprecatedFields nested = 5;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.nested_);
    }
    // int32 deprecated_int32 = 1 [deprecated = true];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_deprecated_int32());
    }
  }
  switch (this_.oneof_fields_case()) {
    // int32 deprecated_int32_in_oneof = 2 [deprecated = true];
    case kDeprecatedInt32InOneof: {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_deprecated_int32_in_oneof());
      break;
    }
    case ONEOF_FIELDS_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}